

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::CreateRuleFile(cmMakefileTargetGenerator *this)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  uint uVar1;
  char *pcVar2;
  cmGeneratedFileStream *pcVar3;
  string *localPath;
  string *this_01;
  allocator local_b1;
  string local_b0;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  string local_50;
  string local_30 [32];
  cmMakefileTargetGenerator *local_10;
  cmMakefileTargetGenerator *this_local;
  
  local_10 = this;
  (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
            (local_30,this->LocalGenerator,this->Target);
  localPath = &this->TargetBuildDirectory;
  std::__cxx11::string::operator=((string *)localPath,local_30);
  std::__cxx11::string::~string(local_30);
  cmLocalUnixMakefileGenerator3::ConvertToFullPath(&local_50,this->LocalGenerator,localPath);
  this_01 = &this->TargetBuildDirectoryFull;
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::MakeDirectory(pcVar2);
  std::__cxx11::string::operator=((string *)&this->BuildFileName,(string *)localPath);
  std::__cxx11::string::operator+=((string *)&this->BuildFileName,"/build.make");
  std::__cxx11::string::operator=((string *)&this->BuildFileNameFull,(string *)this_01);
  std::__cxx11::string::operator+=((string *)&this->BuildFileNameFull,"/build.make");
  std::__cxx11::string::operator=((string *)&this->ProgressFileNameFull,(string *)this_01);
  std::__cxx11::string::operator+=((string *)&this->ProgressFileNameFull,"/progress.make");
  this->NumberOfProgressActions = 0;
  pcVar3 = (cmGeneratedFileStream *)operator_new(0x248);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream(pcVar3,pcVar2,false);
  this->BuildFileStream = pcVar3;
  cmGeneratedFileStream::SetCopyIfDifferent(this->BuildFileStream,true);
  if (this->BuildFileStream != (cmGeneratedFileStream *)0x0) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->BuildFileStream);
    uVar1 = (*(this->GlobalGenerator->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x27])();
    if ((uVar1 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&no_commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90);
      this_00 = this->LocalGenerator;
      pcVar3 = this->BuildFileStream;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,".DELETE_ON_ERROR",&local_b1);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (this_00,(ostream *)pcVar3,"Delete rule output on recipe failure.",&local_b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&no_commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90,false,false);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&no_commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop
              (this->LocalGenerator,(ostream *)this->BuildFileStream);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateRuleFile()
{
  // Create a directory for this target.
  this->TargetBuildDirectory =
    this->LocalGenerator->GetTargetDirectory(*this->Target);
  this->TargetBuildDirectoryFull =
    this->LocalGenerator->ConvertToFullPath(this->TargetBuildDirectory);
  cmSystemTools::MakeDirectory(this->TargetBuildDirectoryFull.c_str());

  // Construct the rule file name.
  this->BuildFileName = this->TargetBuildDirectory;
  this->BuildFileName += "/build.make";
  this->BuildFileNameFull = this->TargetBuildDirectoryFull;
  this->BuildFileNameFull += "/build.make";

  // Construct the rule file name.
  this->ProgressFileNameFull = this->TargetBuildDirectoryFull;
  this->ProgressFileNameFull += "/progress.make";

  // reset the progress count
  this->NumberOfProgressActions = 0;

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->BuildFileStream =
    new cmGeneratedFileStream(this->BuildFileNameFull.c_str());
  this->BuildFileStream->SetCopyIfDifferent(true);
  if(!this->BuildFileStream)
    {
    return;
    }
  this->LocalGenerator->WriteDisclaimer(*this->BuildFileStream);
  if (this->GlobalGenerator->AllowDeleteOnError())
    {
    std::vector<std::string> no_depends;
    std::vector<std::string> no_commands;
    this->LocalGenerator->WriteMakeRule(
      *this->BuildFileStream, "Delete rule output on recipe failure.",
      ".DELETE_ON_ERROR", no_depends, no_commands, false);
    }
  this->LocalGenerator->WriteSpecialTargetsTop(*this->BuildFileStream);
}